

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__is_ipv6_link_local(sockaddr *addr)

{
  bool local_23;
  char local_22;
  char cStack_21;
  uint8_t b [2];
  sockaddr_in6 *a6;
  sockaddr *addr_local;
  
  if (addr->sa_family == 10) {
    local_22 = (char)*(undefined2 *)(addr->sa_data + 6);
    local_23 = false;
    if (local_22 == -2) {
      cStack_21 = (char)((ushort)*(undefined2 *)(addr->sa_data + 6) >> 8);
      local_23 = cStack_21 == -0x80;
    }
    addr_local._4_4_ = (uint)local_23;
  }
  else {
    addr_local._4_4_ = 0;
  }
  return addr_local._4_4_;
}

Assistant:

static int uv__is_ipv6_link_local(const struct sockaddr* addr) {
  const struct sockaddr_in6* a6;
  uint8_t b[2];

  if (addr->sa_family != AF_INET6)
    return 0;

  a6 = (const struct sockaddr_in6*) addr;
  memcpy(b, &a6->sin6_addr, sizeof(b));

  return b[0] == 0xFE && b[1] == 0x80;
}